

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginQuery
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,IQuery *pQuery,int param_2)

{
  bool bVar1;
  COMMAND_QUEUE_TYPE CVar2;
  int iVar3;
  Char *pCVar4;
  undefined4 extraout_var;
  QueryBase<Diligent::EngineGLImplTraits> *this_00;
  COMMAND_QUEUE_TYPE Type;
  String *__return_storage_ptr__;
  COMMAND_QUEUE_TYPE local_119;
  String local_100;
  char *local_e0;
  undefined1 local_d8 [8];
  string msg_4;
  string msg_3;
  string msg_2;
  undefined1 local_70 [7];
  COMMAND_QUEUE_TYPE QueueType;
  string msg_1;
  QUERY_TYPE QueryType;
  undefined1 local_40 [8];
  string msg;
  int param_2_local;
  IQuery *pQuery_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_2;
  if (pQuery == (IQuery *)0x0) {
    FormatString<char[52]>
              ((string *)local_40,
               (char (*) [52])"IDeviceContext::BeginQuery: pQuery must not be null");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x687);
    std::__cxx11::string::~string((string *)local_40);
  }
  iVar3 = (*(pQuery->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  msg_1.field_2._8_4_ = *(int *)(CONCAT44(extraout_var,iVar3) + 8);
  if (msg_1.field_2._8_4_ == 3) {
    FormatString<char[86]>
              ((string *)local_70,
               (char (*) [86])
               "BeginQuery() is disabled for timestamp queries. Call EndQuery() to set the timestamp."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68b);
    std::__cxx11::string::~string((string *)local_70);
  }
  local_119 = COMMAND_QUEUE_TYPE_TRANSFER;
  if (msg_1.field_2._8_4_ != 5) {
    local_119 = COMMAND_QUEUE_TYPE_GRAPHICS;
  }
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar1 = IsDeferred(this);
    if (!bVar1) {
      FormatString<char[79]>
                ((string *)((long)&msg_3.field_2 + 8),
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"BeginQuery",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x68e);
      std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    }
    FormatString<char[97]>
              ((string *)((long)&msg_4.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68e);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  CVar2 = Diligent::operator&((this->m_Desc).QueueType,local_119);
  if (CVar2 != local_119) {
    local_e0 = GetQueryTypeString(msg_1.field_2._8_4_);
    __return_storage_ptr__ = &local_100;
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    FormatString<char[27],char_const*,char[22],std::__cxx11::string,char[8]>
              ((string *)local_d8,(Diligent *)"BeginQuery for query type ",(char (*) [27])&local_e0,
               (char **)0x48656c,(char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
               (char (*) [8])__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_100);
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"BeginQuery",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x68e);
    std::__cxx11::string::~string((string *)local_d8);
  }
  this_00 = &ClassPtrCast<Diligent::QueryGLImpl,Diligent::IQuery>(pQuery)->
             super_QueryBase<Diligent::EngineGLImplTraits>;
  QueryBase<Diligent::EngineGLImplTraits>::OnBeginQuery(this_00,(DeviceContextImplType *)this);
  (this->m_Stats).CommandCounters.BeginQuery = (this->m_Stats).CommandCounters.BeginQuery + 1;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::BeginQuery(IQuery* pQuery, int)
{
    DEV_CHECK_ERR(pQuery != nullptr, "IDeviceContext::BeginQuery: pQuery must not be null");

    const QUERY_TYPE QueryType = pQuery->GetDesc().Type;
    DEV_CHECK_ERR(QueryType != QUERY_TYPE_TIMESTAMP,
                  "BeginQuery() is disabled for timestamp queries. Call EndQuery() to set the timestamp.");

    const COMMAND_QUEUE_TYPE QueueType = QueryType == QUERY_TYPE_DURATION ? COMMAND_QUEUE_TYPE_TRANSFER : COMMAND_QUEUE_TYPE_GRAPHICS;
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(QueueType, "BeginQuery for query type ", GetQueryTypeString(QueryType));

    ClassPtrCast<QueryImplType>(pQuery)->OnBeginQuery(static_cast<DeviceContextImplType*>(this));

    ++m_Stats.CommandCounters.BeginQuery;
}